

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-reverse-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase57::run(TestCase57 *this)

{
  unsigned_short uVar1;
  int local_50;
  bool local_49;
  int local_48;
  bool _kj_shouldLog_5;
  int local_40;
  bool _kj_shouldLog_4;
  int local_38;
  bool local_33;
  unsigned_short uStack_32;
  bool _kj_shouldLog_3;
  int local_30;
  bool _kj_shouldLog_2;
  unsigned_short local_2a;
  int local_28;
  bool _kj_shouldLog_1;
  bool local_21;
  SwappingWireValue<unsigned_short,_2UL> *pSStack_20;
  bool _kj_shouldLog;
  WireValue<uint16_t> *vals;
  TestCase57 *pTStack_10;
  byte bytes [4];
  TestCase57 *this_local;
  
  vals._4_4_ = 0x78563412;
  pSStack_20 = (SwappingWireValue<unsigned_short,_2UL> *)((long)&vals + 4);
  pTStack_10 = this;
  uVar1 = SwappingWireValue<unsigned_short,_2UL>::get(pSStack_20);
  if (uVar1 != 0x1234) {
    local_21 = kj::_::Debug::shouldLog(ERROR);
    while (local_21 != false) {
      local_28 = 0x1234;
      local_2a = SwappingWireValue<unsigned_short,_2UL>::get(pSStack_20);
      kj::_::Debug::log<char_const(&)[45],int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x3e,ERROR,
                 "\"failed: expected \" \"(0x1234) == (vals[0].get())\", 0x1234, vals[0].get()",
                 (char (*) [45])"failed: expected (0x1234) == (vals[0].get())",&local_28,&local_2a);
      local_21 = false;
    }
  }
  uVar1 = SwappingWireValue<unsigned_short,_2UL>::get(pSStack_20 + 1);
  if (uVar1 != 0x5678) {
    _kj_shouldLog_2 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_2 != false) {
      local_30 = 0x5678;
      uStack_32 = SwappingWireValue<unsigned_short,_2UL>::get(pSStack_20 + 1);
      kj::_::Debug::log<char_const(&)[45],int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x3f,ERROR,
                 "\"failed: expected \" \"(0x5678) == (vals[1].get())\", 0x5678, vals[1].get()",
                 (char (*) [45])"failed: expected (0x5678) == (vals[1].get())",&local_30,
                 &stack0xffffffffffffffce);
      _kj_shouldLog_2 = false;
    }
  }
  SwappingWireValue<unsigned_short,_2UL>::set(pSStack_20,0x2345);
  SwappingWireValue<unsigned_short,_2UL>::set(pSStack_20 + 1,0x6789);
  if (vals._4_1_ != '#') {
    local_33 = kj::_::Debug::shouldLog(ERROR);
    while (local_33 != false) {
      local_38 = 0x23;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x44,ERROR,"\"failed: expected \" \"(0x23) == (bytes[0])\", 0x23, bytes[0]",
                 (char (*) [38])"failed: expected (0x23) == (bytes[0])",&local_38,
                 (uchar *)((long)&vals + 4));
      local_33 = false;
    }
  }
  if (vals._5_1_ != 'E') {
    _kj_shouldLog_4 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_40 = 0x45;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x45,ERROR,"\"failed: expected \" \"(0x45) == (bytes[1])\", 0x45, bytes[1]",
                 (char (*) [38])"failed: expected (0x45) == (bytes[1])",&local_40,
                 (uchar *)((long)&vals + 5));
      _kj_shouldLog_4 = false;
    }
  }
  if (vals._6_1_ != 'g') {
    _kj_shouldLog_5 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_5 != false) {
      local_48 = 0x67;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x46,ERROR,"\"failed: expected \" \"(0x67) == (bytes[2])\", 0x67, bytes[2]",
                 (char (*) [38])"failed: expected (0x67) == (bytes[2])",&local_48,
                 (uchar *)((long)&vals + 6));
      _kj_shouldLog_5 = false;
    }
  }
  if (vals._7_1_ != -0x77) {
    local_49 = kj::_::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      local_50 = 0x89;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-reverse-test.c++"
                 ,0x47,ERROR,"\"failed: expected \" \"(0x89) == (bytes[3])\", 0x89, bytes[3]",
                 (char (*) [38])"failed: expected (0x89) == (bytes[3])",&local_50,
                 (uchar *)((long)&vals + 7));
      local_49 = false;
    }
  }
  return;
}

Assistant:

TEST(EndianReverse, TwoBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint16_t>* vals = reinterpret_cast<WireValue<uint16_t>*>(bytes);

  EXPECT_EQ(0x1234, vals[0].get());
  EXPECT_EQ(0x5678, vals[1].get());

  vals[0].set(0x2345);
  vals[1].set(0x6789);

  EXPECT_EQ(0x23, bytes[0]);
  EXPECT_EQ(0x45, bytes[1]);
  EXPECT_EQ(0x67, bytes[2]);
  EXPECT_EQ(0x89, bytes[3]);
}